

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InternalString.cpp
# Opt level: O2

InternalString * Js::InternalString::New(ArenaAllocator *alloc,char16 *content,charcount_t length)

{
  size_t sizeInBytes;
  char *pcVar1;
  InternalString *this;
  ulong uVar2;
  
  uVar2 = (ulong)length;
  sizeInBytes = uVar2 * 2;
  pcVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                     (&alloc->
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                      uVar2 * 2 + 6);
  *(int *)pcVar1 = (int)sizeInBytes;
  js_memcpy_s(pcVar1 + 4,sizeInBytes,content,sizeInBytes);
  (pcVar1 + uVar2 * 2 + 4)[0] = '\0';
  (pcVar1 + uVar2 * 2 + 4)[1] = '\0';
  this = (InternalString *)new<Memory::ArenaAllocator>(0x10,alloc,0x35916e);
  InternalString(this,(char16 *)(pcVar1 + 4),length,'\0');
  return this;
}

Assistant:

InternalString *InternalString::New(ArenaAllocator* alloc, const char16* content, charcount_t length)
    {
        size_t bytelength = sizeof(char16) * length;
        DWORD* allocbuffer = (DWORD*)alloc->Alloc(sizeof(DWORD) + bytelength + sizeof(char16));
        allocbuffer[0] = (DWORD) bytelength;

        char16* buffer = (char16*)(allocbuffer+1);
        js_memcpy_s(buffer, bytelength, content, bytelength);
        buffer[length] = _u('\0');
        InternalString* newInstance = Anew(alloc, InternalString, buffer, length);
        return newInstance;
    }